

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O2

int __thiscall ON_PolyEdgeCurve::FindTrim(ON_PolyEdgeCurve *this,ON_BrepTrim *trim)

{
  int iVar1;
  ON_PolyEdgeSegment *pOVar2;
  int iVar3;
  int segment_index;
  
  iVar3 = -1;
  if (trim != (ON_BrepTrim *)0x0) {
    iVar1 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
    segment_index = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
      segment_index = 0;
    }
    while ((iVar3 = -1, iVar1 != segment_index &&
           ((pOVar2 = SegmentCurve(this,segment_index), pOVar2 == (ON_PolyEdgeSegment *)0x0 ||
            (iVar3 = segment_index, pOVar2->m_trim != trim))))) {
      segment_index = segment_index + 1;
    }
  }
  return iVar3;
}

Assistant:

int ON_PolyEdgeCurve::FindTrim( const ON_BrepTrim* trim) const
{
  int rc = -1;
  if ( 0 != trim )
  {
    int i, count = SegmentCount();
    for( i = 0; i < count; i++)
    {
      ON_PolyEdgeSegment* segment = SegmentCurve(i);
      if ( 0 != segment && trim == segment->BrepTrim() )
      {
        rc = i;
        break;
      }
    }
  }
  return rc;
}